

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void LoadOpenGLFunctions(void)

{
  int iVar1;
  GLubyte *pGVar2;
  int major;
  int minor;
  int local_10 [2];
  
  local_10[0] = 0;
  local_10[1] = 0;
  (*SDL20_memset)(&OpenGLFuncs,0,0x1c0);
  OpenGLFuncs.SUPPORTS_Core = SDL_TRUE;
  OpenGLFuncs.glGetString = (openglfn_glGetString_t)(*SDL20_GL_GetProcAddress)("glGetString");
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetError = (openglfn_glGetError_t)0x0;
LAB_00115e30:
    OpenGLFuncs.glClear = (openglfn_glClear_t)0x0;
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)0x0;
LAB_00115e3a:
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)0x0;
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)0x0;
LAB_00115e44:
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)0x0;
    OpenGLFuncs.glGetIntegerv = (openglfn_glGetIntegerv_t)0x0;
LAB_00115e4e:
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)0x0;
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)0x0;
LAB_00115e58:
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)0x0;
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)0x0;
LAB_00115e62:
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)0x0;
    OpenGLFuncs.glCopyTexImage1D = (openglfn_glCopyTexImage1D_t)0x0;
LAB_00115e6c:
    OpenGLFuncs.glCopyTexSubImage1D = (openglfn_glCopyTexSubImage1D_t)0x0;
    OpenGLFuncs.glCopyTexImage2D = (openglfn_glCopyTexImage2D_t)0x0;
LAB_00115e76:
    OpenGLFuncs.glCopyTexSubImage2D = (openglfn_glCopyTexSubImage2D_t)0x0;
    OpenGLFuncs.glCopyTexSubImage3D = (openglfn_glCopyTexSubImage3D_t)0x0;
LAB_00115e80:
    OpenGLFuncs.glDeleteTextures = (openglfn_glDeleteTextures_t)0x0;
    OpenGLFuncs.glGenTextures = (openglfn_glGenTextures_t)0x0;
LAB_00115e8a:
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)0x0;
    OpenGLFuncs.glPopClientAttrib = (openglfn_glPopClientAttrib_t)0x0;
LAB_00115e94:
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)0x0;
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)0x0;
LAB_00115e9e:
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)0x0;
    OpenGLFuncs.glPushClientAttrib = (openglfn_glPushClientAttrib_t)0x0;
LAB_00115ea8:
    OpenGLFuncs.glBindTexture = (openglfn_glBindTexture_t)0x0;
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)0x0;
LAB_00115eb2:
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)0x0;
    OpenGLFuncs.glTexParameteri = (openglfn_glTexParameteri_t)0x0;
LAB_00115ebc:
    OpenGLFuncs.glPixelStorei = (openglfn_glPixelStorei_t)0x0;
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)0x0;
LAB_00115ec6:
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)0x0;
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)0x0;
LAB_00115ed0:
    OpenGLFuncs.glLoadIdentity = (openglfn_glLoadIdentity_t)0x0;
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)0x0;
LAB_00115eda:
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)0x0;
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)0x0;
LAB_00115ee4:
    OpenGLFuncs.glTexSubImage2D = (openglfn_glTexSubImage2D_t)0x0;
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)0x0;
LAB_00115eee:
    OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)0x0;
  }
  else {
    OpenGLFuncs.glGetError = (openglfn_glGetError_t)(*SDL20_GL_GetProcAddress)("glGetError");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e30;
    OpenGLFuncs.glClear = (openglfn_glClear_t)(*SDL20_GL_GetProcAddress)("glClear");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)0x0;
      goto LAB_00115e3a;
    }
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)(*SDL20_GL_GetProcAddress)("glIsEnabled");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e3a;
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)(*SDL20_GL_GetProcAddress)("glEnable");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glDisable = (openglfn_glDisable_t)0x0;
      goto LAB_00115e44;
    }
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)(*SDL20_GL_GetProcAddress)("glDisable");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e44;
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)(*SDL20_GL_GetProcAddress)("glGetFloatv");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glGetIntegerv = (openglfn_glGetIntegerv_t)0x0;
      goto LAB_00115e4e;
    }
    OpenGLFuncs.glGetIntegerv =
         (openglfn_glGetIntegerv_t)(*SDL20_GL_GetProcAddress)("glGetIntegerv");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e4e;
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)(*SDL20_GL_GetProcAddress)("glClearColor");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glViewport = (openglfn_glViewport_t)0x0;
      goto LAB_00115e58;
    }
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)(*SDL20_GL_GetProcAddress)("glViewport");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e58;
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)(*SDL20_GL_GetProcAddress)("glScissor");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)0x0;
      goto LAB_00115e62;
    }
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)(*SDL20_GL_GetProcAddress)("glReadPixels");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e62;
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)(*SDL20_GL_GetProcAddress)("glCopyPixels");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glCopyTexImage1D = (openglfn_glCopyTexImage1D_t)0x0;
      goto LAB_00115e6c;
    }
    OpenGLFuncs.glCopyTexImage1D =
         (openglfn_glCopyTexImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage1D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e6c;
    OpenGLFuncs.glCopyTexSubImage1D =
         (openglfn_glCopyTexSubImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage1D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glCopyTexImage2D = (openglfn_glCopyTexImage2D_t)0x0;
      goto LAB_00115e76;
    }
    OpenGLFuncs.glCopyTexImage2D =
         (openglfn_glCopyTexImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e76;
    OpenGLFuncs.glCopyTexSubImage2D =
         (openglfn_glCopyTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glCopyTexSubImage3D = (openglfn_glCopyTexSubImage3D_t)0x0;
      goto LAB_00115e80;
    }
    OpenGLFuncs.glCopyTexSubImage3D =
         (openglfn_glCopyTexSubImage3D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage3D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e80;
    OpenGLFuncs.glDeleteTextures =
         (openglfn_glDeleteTextures_t)(*SDL20_GL_GetProcAddress)("glDeleteTextures");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glGenTextures = (openglfn_glGenTextures_t)0x0;
      goto LAB_00115e8a;
    }
    OpenGLFuncs.glGenTextures =
         (openglfn_glGenTextures_t)(*SDL20_GL_GetProcAddress)("glGenTextures");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e8a;
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)(*SDL20_GL_GetProcAddress)("glPopAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPopClientAttrib = (openglfn_glPopClientAttrib_t)0x0;
      goto LAB_00115e94;
    }
    OpenGLFuncs.glPopClientAttrib =
         (openglfn_glPopClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPopClientAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e94;
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)(*SDL20_GL_GetProcAddress)("glPopMatrix");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glBegin = (openglfn_glBegin_t)0x0;
      goto LAB_00115e9e;
    }
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)(*SDL20_GL_GetProcAddress)("glBegin");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115e9e;
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)(*SDL20_GL_GetProcAddress)("glPushAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPushClientAttrib = (openglfn_glPushClientAttrib_t)0x0;
      goto LAB_00115ea8;
    }
    OpenGLFuncs.glPushClientAttrib =
         (openglfn_glPushClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPushClientAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115ea8;
    OpenGLFuncs.glBindTexture =
         (openglfn_glBindTexture_t)(*SDL20_GL_GetProcAddress)("glBindTexture");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glEnd = (openglfn_glEnd_t)0x0;
      goto LAB_00115eb2;
    }
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)(*SDL20_GL_GetProcAddress)("glEnd");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115eb2;
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)(*SDL20_GL_GetProcAddress)("glTexEnvf");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glTexParameteri = (openglfn_glTexParameteri_t)0x0;
      goto LAB_00115ebc;
    }
    OpenGLFuncs.glTexParameteri =
         (openglfn_glTexParameteri_t)(*SDL20_GL_GetProcAddress)("glTexParameteri");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115ebc;
    OpenGLFuncs.glPixelStorei =
         (openglfn_glPixelStorei_t)(*SDL20_GL_GetProcAddress)("glPixelStorei");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)0x0;
      goto LAB_00115ec6;
    }
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)(*SDL20_GL_GetProcAddress)("glBlendFunc");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115ec6;
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)(*SDL20_GL_GetProcAddress)("glColor4f");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)0x0;
      goto LAB_00115ed0;
    }
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)(*SDL20_GL_GetProcAddress)("glMatrixMode");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115ed0;
    OpenGLFuncs.glLoadIdentity =
         (openglfn_glLoadIdentity_t)(*SDL20_GL_GetProcAddress)("glLoadIdentity");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)0x0;
      goto LAB_00115eda;
    }
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)(*SDL20_GL_GetProcAddress)("glPushMatrix");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115eda;
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)(*SDL20_GL_GetProcAddress)("glOrtho");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)0x0;
      goto LAB_00115ee4;
    }
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)(*SDL20_GL_GetProcAddress)("glTexImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115ee4;
    OpenGLFuncs.glTexSubImage2D =
         (openglfn_glTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glTexSubImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)0x0;
      goto LAB_00115eee;
    }
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)(*SDL20_GL_GetProcAddress)("glVertex2i");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00115eee;
    OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)(*SDL20_GL_GetProcAddress)("glTexCoord2f");
  }
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBindRenderbuffer = (openglfn_glBindRenderbuffer_t)0x0;
LAB_001160a2:
    OpenGLFuncs.glDeleteRenderbuffers = (openglfn_glDeleteRenderbuffers_t)0x0;
    OpenGLFuncs.glGenRenderbuffers = (openglfn_glGenRenderbuffers_t)0x0;
LAB_001160ac:
    OpenGLFuncs.glRenderbufferStorage = (openglfn_glRenderbufferStorage_t)0x0;
    OpenGLFuncs.glRenderbufferStorageMultisample = (openglfn_glRenderbufferStorageMultisample_t)0x0;
LAB_001160b6:
    OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
    OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
LAB_001160c0:
    OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
    OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
LAB_001160ca:
    OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
    OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
LAB_001160d4:
    OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
LAB_001160df:
    OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBindRenderbuffer =
         (openglfn_glBindRenderbuffer_t)(*SDL20_GL_GetProcAddress)("glBindRenderbuffer");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160a2;
    OpenGLFuncs.glDeleteRenderbuffers =
         (openglfn_glDeleteRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteRenderbuffers");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
      OpenGLFuncs.glGenRenderbuffers = (openglfn_glGenRenderbuffers_t)0x0;
      goto LAB_001160ac;
    }
    OpenGLFuncs.glGenRenderbuffers =
         (openglfn_glGenRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glGenRenderbuffers");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160ac;
    OpenGLFuncs.glRenderbufferStorage =
         (openglfn_glRenderbufferStorage_t)(*SDL20_GL_GetProcAddress)("glRenderbufferStorage");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
      OpenGLFuncs.glRenderbufferStorageMultisample =
           (openglfn_glRenderbufferStorageMultisample_t)0x0;
      goto LAB_001160b6;
    }
    OpenGLFuncs.glRenderbufferStorageMultisample =
         (openglfn_glRenderbufferStorageMultisample_t)
         (*SDL20_GL_GetProcAddress)("glRenderbufferStorageMultisample");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160b6;
    OpenGLFuncs.glGetRenderbufferParameteriv =
         (openglfn_glGetRenderbufferParameteriv_t)
         (*SDL20_GL_GetProcAddress)("glGetRenderbufferParameteriv");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
      OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
      goto LAB_001160c0;
    }
    OpenGLFuncs.glIsFramebuffer =
         (openglfn_glIsFramebuffer_t)(*SDL20_GL_GetProcAddress)("glIsFramebuffer");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160c0;
    OpenGLFuncs.glBindFramebuffer =
         (openglfn_glBindFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBindFramebuffer");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
      OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
      goto LAB_001160ca;
    }
    OpenGLFuncs.glDeleteFramebuffers =
         (openglfn_glDeleteFramebuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteFramebuffers");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160ca;
    OpenGLFuncs.glGenFramebuffers =
         (openglfn_glGenFramebuffers_t)(*SDL20_GL_GetProcAddress)("glGenFramebuffers");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
      OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
      goto LAB_001160d4;
    }
    OpenGLFuncs.glCheckFramebufferStatus =
         (openglfn_glCheckFramebufferStatus_t)(*SDL20_GL_GetProcAddress)("glCheckFramebufferStatus")
    ;
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160d4;
    OpenGLFuncs.glFramebufferRenderbuffer =
         (openglfn_glFramebufferRenderbuffer_t)
         (*SDL20_GL_GetProcAddress)("glFramebufferRenderbuffer");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) goto LAB_001160df;
    OpenGLFuncs.glBlitFramebuffer =
         (openglfn_glBlitFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBlitFramebuffer");
  }
  pGVar2 = (*OpenGLFuncs.glGetString)(0x1f02);
  if ((pGVar2 == (GLubyte *)0x0) ||
     (iVar1 = (*SDL20_sscanf)((char *)pGVar2,"%d.%d",local_10,local_10 + 1), iVar1 != 2)) {
    local_10[1] = 0;
    local_10[0] = 0;
  }
  OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object =
       (*SDL20_GL_ExtensionSupported)("GL_ARB_framebuffer_object");
  OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two =
       (*SDL20_GL_ExtensionSupported)("GL_ARB_texture_non_power_of_two");
  if (local_10[0] < 3) {
    if (local_10[0] == 2) goto LAB_00116163;
  }
  else {
    OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object = SDL_TRUE;
LAB_00116163:
    OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two = SDL_TRUE;
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    OpenGLFuncs.glGetString = (openglfn_glGetString_t)0x0;
LAB_001166bf:
    OpenGLFuncs.glGetError = (openglfn_glGetError_t)0x0;
    OpenGLFuncs.glClear = (openglfn_glClear_t)0x0;
LAB_001166c9:
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)0x0;
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)0x0;
LAB_001166d3:
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)0x0;
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)0x0;
LAB_001166dd:
    OpenGLFuncs.glGetIntegerv = (openglfn_glGetIntegerv_t)0x0;
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)0x0;
LAB_001166e7:
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)0x0;
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)0x0;
LAB_001166f1:
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)0x0;
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)0x0;
LAB_001166fb:
    OpenGLFuncs.glCopyTexImage1D = (openglfn_glCopyTexImage1D_t)0x0;
    OpenGLFuncs.glCopyTexSubImage1D = (openglfn_glCopyTexSubImage1D_t)0x0;
LAB_00116705:
    OpenGLFuncs.glCopyTexImage2D = (openglfn_glCopyTexImage2D_t)0x0;
    OpenGLFuncs.glCopyTexSubImage2D = (openglfn_glCopyTexSubImage2D_t)0x0;
LAB_0011670f:
    OpenGLFuncs.glCopyTexSubImage3D = (openglfn_glCopyTexSubImage3D_t)0x0;
    OpenGLFuncs.glDeleteTextures = (openglfn_glDeleteTextures_t)0x0;
LAB_00116719:
    OpenGLFuncs.glGenTextures = (openglfn_glGenTextures_t)0x0;
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)0x0;
LAB_00116723:
    OpenGLFuncs.glPopClientAttrib = (openglfn_glPopClientAttrib_t)0x0;
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)0x0;
LAB_0011672d:
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)0x0;
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)0x0;
LAB_00116737:
    OpenGLFuncs.glPushClientAttrib = (openglfn_glPushClientAttrib_t)0x0;
    OpenGLFuncs.glBindTexture = (openglfn_glBindTexture_t)0x0;
LAB_00116741:
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)0x0;
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)0x0;
LAB_0011674b:
    OpenGLFuncs.glTexParameteri = (openglfn_glTexParameteri_t)0x0;
    OpenGLFuncs.glPixelStorei = (openglfn_glPixelStorei_t)0x0;
LAB_00116755:
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)0x0;
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)0x0;
LAB_0011675f:
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)0x0;
    OpenGLFuncs.glLoadIdentity = (openglfn_glLoadIdentity_t)0x0;
LAB_00116769:
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)0x0;
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)0x0;
LAB_00116773:
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)0x0;
    OpenGLFuncs.glTexSubImage2D = (openglfn_glTexSubImage2D_t)0x0;
LAB_0011677d:
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)0x0;
  }
  else {
    OpenGLFuncs.glGetString = (openglfn_glGetString_t)(*SDL20_GL_GetProcAddress)("glGetString");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166bf;
    OpenGLFuncs.glGetError = (openglfn_glGetError_t)(*SDL20_GL_GetProcAddress)("glGetError");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glClear = (openglfn_glClear_t)0x0;
      goto LAB_001166c9;
    }
    OpenGLFuncs.glClear = (openglfn_glClear_t)(*SDL20_GL_GetProcAddress)("glClear");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166c9;
    OpenGLFuncs.glIsEnabled = (openglfn_glIsEnabled_t)(*SDL20_GL_GetProcAddress)("glIsEnabled");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glEnable = (openglfn_glEnable_t)0x0;
      goto LAB_001166d3;
    }
    OpenGLFuncs.glEnable = (openglfn_glEnable_t)(*SDL20_GL_GetProcAddress)("glEnable");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166d3;
    OpenGLFuncs.glDisable = (openglfn_glDisable_t)(*SDL20_GL_GetProcAddress)("glDisable");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)0x0;
      goto LAB_001166dd;
    }
    OpenGLFuncs.glGetFloatv = (openglfn_glGetFloatv_t)(*SDL20_GL_GetProcAddress)("glGetFloatv");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166dd;
    OpenGLFuncs.glGetIntegerv =
         (openglfn_glGetIntegerv_t)(*SDL20_GL_GetProcAddress)("glGetIntegerv");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)0x0;
      goto LAB_001166e7;
    }
    OpenGLFuncs.glClearColor = (openglfn_glClearColor_t)(*SDL20_GL_GetProcAddress)("glClearColor");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166e7;
    OpenGLFuncs.glViewport = (openglfn_glViewport_t)(*SDL20_GL_GetProcAddress)("glViewport");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glScissor = (openglfn_glScissor_t)0x0;
      goto LAB_001166f1;
    }
    OpenGLFuncs.glScissor = (openglfn_glScissor_t)(*SDL20_GL_GetProcAddress)("glScissor");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166f1;
    OpenGLFuncs.glReadPixels = (openglfn_glReadPixels_t)(*SDL20_GL_GetProcAddress)("glReadPixels");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)0x0;
      goto LAB_001166fb;
    }
    OpenGLFuncs.glCopyPixels = (openglfn_glCopyPixels_t)(*SDL20_GL_GetProcAddress)("glCopyPixels");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_001166fb;
    OpenGLFuncs.glCopyTexImage1D =
         (openglfn_glCopyTexImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage1D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glCopyTexSubImage1D = (openglfn_glCopyTexSubImage1D_t)0x0;
      goto LAB_00116705;
    }
    OpenGLFuncs.glCopyTexSubImage1D =
         (openglfn_glCopyTexSubImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage1D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116705;
    OpenGLFuncs.glCopyTexImage2D =
         (openglfn_glCopyTexImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glCopyTexSubImage2D = (openglfn_glCopyTexSubImage2D_t)0x0;
      goto LAB_0011670f;
    }
    OpenGLFuncs.glCopyTexSubImage2D =
         (openglfn_glCopyTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_0011670f;
    OpenGLFuncs.glCopyTexSubImage3D =
         (openglfn_glCopyTexSubImage3D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage3D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glDeleteTextures = (openglfn_glDeleteTextures_t)0x0;
      goto LAB_00116719;
    }
    OpenGLFuncs.glDeleteTextures =
         (openglfn_glDeleteTextures_t)(*SDL20_GL_GetProcAddress)("glDeleteTextures");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116719;
    OpenGLFuncs.glGenTextures =
         (openglfn_glGenTextures_t)(*SDL20_GL_GetProcAddress)("glGenTextures");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)0x0;
      goto LAB_00116723;
    }
    OpenGLFuncs.glPopAttrib = (openglfn_glPopAttrib_t)(*SDL20_GL_GetProcAddress)("glPopAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116723;
    OpenGLFuncs.glPopClientAttrib =
         (openglfn_glPopClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPopClientAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)0x0;
      goto LAB_0011672d;
    }
    OpenGLFuncs.glPopMatrix = (openglfn_glPopMatrix_t)(*SDL20_GL_GetProcAddress)("glPopMatrix");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_0011672d;
    OpenGLFuncs.glBegin = (openglfn_glBegin_t)(*SDL20_GL_GetProcAddress)("glBegin");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)0x0;
      goto LAB_00116737;
    }
    OpenGLFuncs.glPushAttrib = (openglfn_glPushAttrib_t)(*SDL20_GL_GetProcAddress)("glPushAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116737;
    OpenGLFuncs.glPushClientAttrib =
         (openglfn_glPushClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPushClientAttrib");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glBindTexture = (openglfn_glBindTexture_t)0x0;
      goto LAB_00116741;
    }
    OpenGLFuncs.glBindTexture =
         (openglfn_glBindTexture_t)(*SDL20_GL_GetProcAddress)("glBindTexture");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116741;
    OpenGLFuncs.glEnd = (openglfn_glEnd_t)(*SDL20_GL_GetProcAddress)("glEnd");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)0x0;
      goto LAB_0011674b;
    }
    OpenGLFuncs.glTexEnvf = (openglfn_glTexEnvf_t)(*SDL20_GL_GetProcAddress)("glTexEnvf");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_0011674b;
    OpenGLFuncs.glTexParameteri =
         (openglfn_glTexParameteri_t)(*SDL20_GL_GetProcAddress)("glTexParameteri");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glPixelStorei = (openglfn_glPixelStorei_t)0x0;
      goto LAB_00116755;
    }
    OpenGLFuncs.glPixelStorei =
         (openglfn_glPixelStorei_t)(*SDL20_GL_GetProcAddress)("glPixelStorei");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116755;
    OpenGLFuncs.glBlendFunc = (openglfn_glBlendFunc_t)(*SDL20_GL_GetProcAddress)("glBlendFunc");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)0x0;
      goto LAB_0011675f;
    }
    OpenGLFuncs.glColor4f = (openglfn_glColor4f_t)(*SDL20_GL_GetProcAddress)("glColor4f");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_0011675f;
    OpenGLFuncs.glMatrixMode = (openglfn_glMatrixMode_t)(*SDL20_GL_GetProcAddress)("glMatrixMode");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glLoadIdentity = (openglfn_glLoadIdentity_t)0x0;
      goto LAB_00116769;
    }
    OpenGLFuncs.glLoadIdentity =
         (openglfn_glLoadIdentity_t)(*SDL20_GL_GetProcAddress)("glLoadIdentity");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116769;
    OpenGLFuncs.glPushMatrix = (openglfn_glPushMatrix_t)(*SDL20_GL_GetProcAddress)("glPushMatrix");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)0x0;
      goto LAB_00116773;
    }
    OpenGLFuncs.glOrtho = (openglfn_glOrtho_t)(*SDL20_GL_GetProcAddress)("glOrtho");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_00116773;
    OpenGLFuncs.glTexImage2D = (openglfn_glTexImage2D_t)(*SDL20_GL_GetProcAddress)("glTexImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
      OpenGLFuncs.glTexSubImage2D = (openglfn_glTexSubImage2D_t)0x0;
      goto LAB_0011677d;
    }
    OpenGLFuncs.glTexSubImage2D =
         (openglfn_glTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glTexSubImage2D");
    if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) goto LAB_0011677d;
    OpenGLFuncs.glVertex2i = (openglfn_glVertex2i_t)(*SDL20_GL_GetProcAddress)("glVertex2i");
    if (OpenGLFuncs.SUPPORTS_Core != SDL_FALSE) {
      OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)(*SDL20_GL_GetProcAddress)("glTexCoord2f")
      ;
      goto LAB_0011678a;
    }
  }
  OpenGLFuncs.glTexCoord2f = (openglfn_glTexCoord2f_t)0x0;
LAB_0011678a:
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    OpenGLFuncs.glBindRenderbuffer = (openglfn_glBindRenderbuffer_t)0x0;
  }
  else {
    OpenGLFuncs.glBindRenderbuffer =
         (openglfn_glBindRenderbuffer_t)(*SDL20_GL_GetProcAddress)("glBindRenderbuffer");
    if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object != SDL_FALSE) {
      OpenGLFuncs.glDeleteRenderbuffers =
           (openglfn_glDeleteRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteRenderbuffers");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glGenRenderbuffers = (openglfn_glGenRenderbuffers_t)0x0;
        OpenGLFuncs.glRenderbufferStorage = (openglfn_glRenderbufferStorage_t)0x0;
        OpenGLFuncs.glRenderbufferStorageMultisample =
             (openglfn_glRenderbufferStorageMultisample_t)0x0;
        OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
        OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
        OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glGenRenderbuffers =
           (openglfn_glGenRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glGenRenderbuffers");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glRenderbufferStorage = (openglfn_glRenderbufferStorage_t)0x0;
        OpenGLFuncs.glRenderbufferStorageMultisample =
             (openglfn_glRenderbufferStorageMultisample_t)0x0;
        OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
        OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
        OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glRenderbufferStorage =
           (openglfn_glRenderbufferStorage_t)(*SDL20_GL_GetProcAddress)("glRenderbufferStorage");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glRenderbufferStorageMultisample =
             (openglfn_glRenderbufferStorageMultisample_t)0x0;
        OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
        OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
        OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glRenderbufferStorageMultisample =
           (openglfn_glRenderbufferStorageMultisample_t)
           (*SDL20_GL_GetProcAddress)("glRenderbufferStorageMultisample");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
        OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
        OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glGetRenderbufferParameteriv =
           (openglfn_glGetRenderbufferParameteriv_t)
           (*SDL20_GL_GetProcAddress)("glGetRenderbufferParameteriv");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
        OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glIsFramebuffer =
           (openglfn_glIsFramebuffer_t)(*SDL20_GL_GetProcAddress)("glIsFramebuffer");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glBindFramebuffer =
           (openglfn_glBindFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBindFramebuffer");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
        OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
        OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
        OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
        OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glDeleteFramebuffers =
           (openglfn_glDeleteFramebuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteFramebuffers");
      if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object != SDL_FALSE) {
        OpenGLFuncs.glGenFramebuffers =
             (openglfn_glGenFramebuffers_t)(*SDL20_GL_GetProcAddress)("glGenFramebuffers");
        if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
          OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
          OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
          OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
          return;
        }
        OpenGLFuncs.glCheckFramebufferStatus =
             (openglfn_glCheckFramebufferStatus_t)
             (*SDL20_GL_GetProcAddress)("glCheckFramebufferStatus");
        if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
          OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
          OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
          return;
        }
        OpenGLFuncs.glFramebufferRenderbuffer =
             (openglfn_glFramebufferRenderbuffer_t)
             (*SDL20_GL_GetProcAddress)("glFramebufferRenderbuffer");
        if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object != SDL_FALSE) {
          OpenGLFuncs.glBlitFramebuffer =
               (openglfn_glBlitFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBlitFramebuffer");
          return;
        }
        OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
        return;
      }
      OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
      OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
      OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
      OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
      return;
    }
  }
  OpenGLFuncs.glFramebufferRenderbuffer = (openglfn_glFramebufferRenderbuffer_t)0x0;
  OpenGLFuncs.glCheckFramebufferStatus = (openglfn_glCheckFramebufferStatus_t)0x0;
  OpenGLFuncs.glGenFramebuffers = (openglfn_glGenFramebuffers_t)0x0;
  OpenGLFuncs.glDeleteFramebuffers = (openglfn_glDeleteFramebuffers_t)0x0;
  OpenGLFuncs.glBindFramebuffer = (openglfn_glBindFramebuffer_t)0x0;
  OpenGLFuncs.glIsFramebuffer = (openglfn_glIsFramebuffer_t)0x0;
  OpenGLFuncs.glGetRenderbufferParameteriv = (openglfn_glGetRenderbufferParameteriv_t)0x0;
  OpenGLFuncs.glRenderbufferStorageMultisample = (openglfn_glRenderbufferStorageMultisample_t)0x0;
  OpenGLFuncs.glRenderbufferStorage = (openglfn_glRenderbufferStorage_t)0x0;
  OpenGLFuncs.glGenRenderbuffers = (openglfn_glGenRenderbuffers_t)0x0;
  OpenGLFuncs.glDeleteRenderbuffers = (openglfn_glDeleteRenderbuffers_t)0x0;
  OpenGLFuncs.glBlitFramebuffer = (openglfn_glBlitFramebuffer_t)0x0;
  return;
}

Assistant:

static void
LoadOpenGLFunctions(void)
{
    const char *version;
    int major = 0, minor = 0;

    /* load core functions so we can guess about a few other things. */
    SDL20_zero(OpenGLFuncs);
    OpenGLFuncs.SUPPORTS_Core = SDL_TRUE;
    #define OPENGL_SYM(ext,rc,fn,params,args,ret) OpenGLFuncs.fn = \
           (OpenGLFuncs.SUPPORTS_##ext)? (openglfn_##fn##_t)SDL20_GL_GetProcAddress(#fn) : NULL;
    #include "SDL20_syms.h"

    version = (const char *) OpenGLFuncs.glGetString(GL_VERSION);
    if (!version || (SDL20_sscanf(version, "%d.%d", &major, &minor) != 2)) {
        major = minor = 0;
    }

    /* Lookup reported extensions. */
    #define OPENGL_EXT(name) OpenGLFuncs.SUPPORTS_##name = SDL20_GL_ExtensionSupported(#name);
    #include "SDL20_syms.h"

    /* GL_ARB_framebuffer_object is in core OpenGL 3.0+ with the same entry point names as the extension version. */
    if (major >= 3) {
        OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object = SDL_TRUE;
    }

    if (major >= 2) {
        OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two = SDL_TRUE;  /* core since 2.0 */
    }

    /* load everything we can. */
    #define OPENGL_SYM(ext,rc,fn,params,args,ret) OpenGLFuncs.fn = \
           (OpenGLFuncs.SUPPORTS_##ext)? (openglfn_##fn##_t)SDL20_GL_GetProcAddress(#fn) : NULL;
    #include "SDL20_syms.h"
}